

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proctitle.c
# Opt level: O3

int uv_set_process_title(char *title)

{
  size_t local_28;
  size_t len;
  uv__process_title *pt;
  char *title_local;
  
  if (args_mem == (void *)0x0) {
    title_local._4_4_ = -0x69;
  }
  else {
    local_28 = strlen(title);
    uv_once(&process_title_mutex_once,init_process_title_mutex_once);
    uv_mutex_lock(&process_title_mutex);
    if ((process_title.cap <= local_28) && (local_28 = 0, process_title.cap != 0)) {
      local_28 = process_title.cap - 1;
    }
    memcpy(process_title.str,title,local_28);
    memset(process_title.str + local_28,0,process_title.cap - local_28);
    process_title.len = local_28;
    uv__set_process_title(process_title.str);
    uv_mutex_unlock(&process_title_mutex);
    title_local._4_4_ = 0;
  }
  return title_local._4_4_;
}

Assistant:

int uv_set_process_title(const char* title) {
  struct uv__process_title* pt;
  size_t len;

  /* If uv_setup_args wasn't called or failed, we can't continue. */
  if (args_mem == NULL)
    return UV_ENOBUFS;

  pt = &process_title;
  len = strlen(title);

  uv_once(&process_title_mutex_once, init_process_title_mutex_once);
  uv_mutex_lock(&process_title_mutex);

  if (len >= pt->cap) {
    len = 0;
    if (pt->cap > 0)
      len = pt->cap - 1;
  }

  memcpy(pt->str, title, len);
  memset(pt->str + len, '\0', pt->cap - len);
  pt->len = len;
  uv__set_process_title(pt->str);

  uv_mutex_unlock(&process_title_mutex);

  return 0;
}